

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O3

String * File::getAbsolutePath(String *__return_storage_ptr__,String *path)

{
  usize minCapacity;
  ulong copyLength;
  usize copyLength_00;
  Data *pDVar1;
  bool bVar2;
  ulong minCapacity_00;
  
  bVar2 = isAbsolutePath(path);
  if (bVar2) {
    String::String(__return_storage_ptr__,path);
  }
  else {
    Directory::getCurrentDirectory();
    copyLength = __return_storage_ptr__->data->len;
    minCapacity_00 = copyLength + path->data->len + 1;
    if (minCapacity_00 < copyLength) {
      minCapacity_00 = copyLength;
    }
    String::detach(__return_storage_ptr__,copyLength,minCapacity_00);
    copyLength_00 = __return_storage_ptr__->data->len;
    minCapacity = copyLength_00 + 1;
    String::detach(__return_storage_ptr__,copyLength_00,minCapacity);
    __return_storage_ptr__->data->str[__return_storage_ptr__->data->len] = '/';
    pDVar1 = __return_storage_ptr__->data;
    pDVar1->len = minCapacity;
    pDVar1->str[minCapacity] = '\0';
    String::append(__return_storage_ptr__,path);
  }
  return __return_storage_ptr__;
}

Assistant:

String File::getAbsolutePath(const String& path)
{
  if(isAbsolutePath(path))
    return path;
  String result = Directory::getCurrentDirectory();
  result.reserve(result.length() + 1 + path.length());
  result.append('/');
  result.append(path);
  return result;
}